

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdGetDescriptorRootData
              (void *handle,void *descriptor_handle,int *script_type,char **locking_script,
              char **address,int *hash_type,char **redeem_script,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey,char **schnorr_pubkey,char **tree_string,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int *piVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  string *psVar8;
  undefined8 uVar9;
  bool bVar10;
  CfdException *this;
  pointer puVar11;
  _Alloc_hider _Var12;
  SchnorrPubkey spk;
  char *work_tree_string;
  char *work_schnorr_pubkey;
  char *work_ext_privkey;
  char *work_ext_pubkey;
  char *work_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  string addr;
  undefined1 local_278 [40];
  pointer local_250;
  pointer puStack_248;
  pointer local_240;
  pointer local_238;
  pointer puStack_230;
  pointer local_228;
  pointer local_220;
  pointer puStack_218;
  pointer puStack_210;
  pointer puStack_208;
  Pubkey local_1f8;
  string local_1d8;
  char *local_1b8;
  char *local_1b0;
  void *local_1a8;
  char **local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 local_168 [40];
  pointer local_140;
  pointer puStack_138;
  pointer puStack_130;
  pointer local_128;
  pointer puStack_120;
  pointer puStack_118;
  pointer local_110;
  pointer local_108;
  pointer puStack_100;
  pointer puStack_f8;
  ExtPubkey local_e8;
  SchnorrPubkey local_78;
  char **local_58;
  string local_50;
  
  local_170 = (char *)0x0;
  local_178 = (char *)0x0;
  local_180 = (char *)0x0;
  local_188 = (char *)0x0;
  local_190 = (char *)0x0;
  local_198 = (char *)0x0;
  local_1b0 = (char *)0x0;
  local_1b8 = (char *)0x0;
  local_1a8 = handle;
  local_1a0 = address;
  local_58 = locking_script;
  cfd::Initialize();
  puVar11 = local_168 + 0x10;
  local_168._0_8_ = puVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Descriptor","");
  cfd::capi::CheckBuffer(descriptor_handle,(string *)local_168);
  if ((pointer)local_168._0_8_ != puVar11) {
    operator_delete((void *)local_168._0_8_);
  }
  puVar3 = *(undefined8 **)((long)descriptor_handle + 0x10);
  if ((puVar3 == (undefined8 *)0x0) || (piVar4 = (int *)*puVar3, piVar4 == (int *)puVar3[1])) {
    local_168._0_8_ = "cfdcapi_address.cpp";
    local_168._8_4_ = 0x1fd;
    local_168._16_8_ = "CfdGetDescriptorRootData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_168,kCfdLogLevelWarning,"invalid script_root.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_168._0_8_ = puVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Failed to parameter. invalid script_root.","");
    cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_168);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  iVar1 = piVar4[0x70];
  if (script_type != (int *)0x0) {
    *script_type = *piVar4;
  }
  if (local_58 != (char **)0x0) {
    bVar10 = cfd::core::Script::IsEmpty((Script *)(piVar4 + 2));
    if (!bVar10) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_168,(Script *)(piVar4 + 2));
      local_170 = cfd::capi::CreateString((string *)local_168);
      if ((pointer)local_168._0_8_ != puVar11) {
        operator_delete((void *)local_168._0_8_);
      }
    }
  }
  if (local_1a0 == (char **)0x0) {
    bVar10 = false;
  }
  else {
    cfd::core::Address::GetAddress_abi_cxx11_(&local_50,(Address *)(piVar4 + 0x12));
    bVar10 = local_50._M_string_length != 0;
  }
  if ((local_1a0 != (char **)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar10) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_168,(Address *)(piVar4 + 0x12));
    if ((pointer)local_168._8_8_ != (pointer)0x0) {
      local_178 = cfd::capi::CreateString((string *)local_168);
    }
    if ((pointer)local_168._0_8_ != puVar11) {
      operator_delete((void *)local_168._0_8_);
    }
  }
  if (hash_type != (int *)0x0) {
    *hash_type = piVar4[0x70];
  }
  if (redeem_script != (char **)0x0) {
    bVar10 = cfd::core::Script::IsEmpty((Script *)(piVar4 + 0x72));
    if (!bVar10) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_168,(Script *)(piVar4 + 0x72));
      local_180 = cfd::capi::CreateString((string *)local_168);
      if ((pointer)local_168._0_8_ != puVar11) {
        operator_delete((void *)local_168._0_8_);
      }
    }
  }
  if (key_type != (int *)0x0) {
    *key_type = piVar4[0x80];
  }
  cfd::core::Pubkey::Pubkey(&local_1f8);
  cfd::core::ExtPubkey::ExtPubkey(&local_e8);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_168);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_78);
  iVar2 = piVar4[0x80];
  if (iVar2 == 2) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_278,(string *)(piVar4 + 0x82));
    puVar11 = local_e8.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
    local_e8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
    local_e8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_278._16_8_;
    local_278._0_8_ = (pointer)0x0;
    local_278._8_8_ = (pointer)0x0;
    local_278._16_8_ = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_e8.chaincode_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.version_ = local_278._24_4_;
    local_e8.fingerprint_ = local_278._28_4_;
    local_e8.depth_ = local_278[0x20];
    local_e8._33_3_ = local_278._33_3_;
    local_e8.child_num_ = local_278._36_4_;
    local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_250;
    local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_248;
    local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_240;
    local_250 = (pointer)0x0;
    puStack_248 = (pointer)0x0;
    local_240 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_e8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_238;
    local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_230;
    local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_228;
    local_238 = (pointer)0x0;
    puStack_230 = (pointer)0x0;
    local_228 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_e8.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_220;
    local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_218;
    local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_210;
    local_220 = (pointer)0x0;
    puStack_218 = (pointer)0x0;
    puStack_210 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    if (local_220 != (pointer)0x0) {
      operator_delete(local_220);
    }
    if (local_238 != (pointer)0x0) {
      operator_delete(local_238);
    }
    if (local_250 != (pointer)0x0) {
      operator_delete(local_250);
    }
    if ((pointer)local_278._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_278._0_8_);
    }
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_278,&local_e8);
LAB_003e4a61:
    puVar11 = local_1f8.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
    local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
    local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_278._16_8_;
LAB_003e4a8e:
    local_278._0_8_ = (pointer)0x0;
    local_278._8_8_ = (pointer)0x0;
    local_278._16_8_ = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    if ((pointer)local_278._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_278._0_8_);
    }
  }
  else {
    if (iVar2 == 3) {
      cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_278,(string *)(piVar4 + 0x82));
      uVar9 = local_168._0_8_;
      local_168._0_8_ = local_278._0_8_;
      local_168._8_8_ = local_278._8_8_;
      local_168._16_8_ = local_278._16_8_;
      local_278._0_8_ = (pointer)0x0;
      local_278._8_8_ = (pointer)0x0;
      local_278._16_8_ = (pointer)0x0;
      if ((pointer)uVar9 != (pointer)0x0) {
        operator_delete((void *)uVar9);
      }
      puVar11 = local_140;
      local_168._24_8_ = local_278._24_8_;
      local_168._32_8_ = local_278._32_8_;
      local_140 = local_250;
      puStack_138 = puStack_248;
      puStack_130 = local_240;
      local_250 = (pointer)0x0;
      puStack_248 = (pointer)0x0;
      local_240 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_128;
      local_128 = local_238;
      puStack_120 = puStack_230;
      puStack_118 = local_228;
      local_238 = (pointer)0x0;
      puStack_230 = (pointer)0x0;
      local_228 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_108;
      local_110 = local_220;
      local_108 = puStack_218;
      puStack_100 = puStack_210;
      puStack_f8 = puStack_208;
      puStack_218 = (pointer)0x0;
      puStack_210 = (pointer)0x0;
      puStack_208 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      if (puStack_218 != (pointer)0x0) {
        operator_delete(puStack_218);
      }
      if (local_238 != (pointer)0x0) {
        operator_delete(local_238);
      }
      if (local_250 != (pointer)0x0) {
        operator_delete(local_250);
      }
      if ((pointer)local_278._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_278._0_8_);
      }
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_278,(ExtPrivkey *)local_168);
      puVar11 = local_e8.serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
      local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
      local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_278._16_8_;
      local_278._0_8_ = (pointer)0x0;
      local_278._8_8_ = (pointer)0x0;
      local_278._16_8_ = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8.chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.version_ = local_278._24_4_;
      local_e8.fingerprint_ = local_278._28_4_;
      local_e8.depth_ = local_278[0x20];
      local_e8._33_3_ = local_278._33_3_;
      local_e8.child_num_ = local_278._36_4_;
      local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_250;
      local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_248;
      local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_240;
      local_250 = (pointer)0x0;
      puStack_248 = (pointer)0x0;
      local_240 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = local_238;
      local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = puStack_230;
      local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_228;
      local_238 = (pointer)0x0;
      puStack_230 = (pointer)0x0;
      local_228 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8.tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_220;
      local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_218;
      local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_210;
      local_220 = (pointer)0x0;
      puStack_218 = (pointer)0x0;
      puStack_210 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      if (local_220 != (pointer)0x0) {
        operator_delete(local_220);
      }
      if (local_238 != (pointer)0x0) {
        operator_delete(local_238);
      }
      if (local_250 != (pointer)0x0) {
        operator_delete(local_250);
      }
      if ((pointer)local_278._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_278._0_8_);
      }
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_278,&local_e8);
      goto LAB_003e4a61;
    }
    if (iVar2 == 4) {
      if (*(long *)(piVar4 + 0x84) == 0) goto LAB_003e4abb;
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_278,(string *)(piVar4 + 0x82));
      puVar11 = local_78.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_278._16_8_;
      goto LAB_003e4a8e;
    }
    if (*(long *)(piVar4 + 0x84) != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_278,(string *)(piVar4 + 0x82));
      goto LAB_003e4a61;
    }
  }
LAB_003e4abb:
  if ((schnorr_pubkey != (char **)0x0) && (iVar1 == 7)) {
    bVar10 = cfd::core::Pubkey::IsValid(&local_1f8);
    if (bVar10) {
      cfd::core::SchnorrPubkey::FromPubkey((SchnorrPubkey *)&local_1d8,&local_1f8,(bool *)0x0);
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_278,(SchnorrPubkey *)&local_1d8);
      local_1b0 = cfd::capi::CreateString((string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
      }
      _Var12._M_p = local_1d8._M_dataplus._M_p;
      if ((pointer)local_1d8._M_dataplus._M_p != (pointer)0x0) {
LAB_003e4b7f:
        operator_delete(_Var12._M_p);
      }
    }
    else {
      bVar10 = cfd::core::SchnorrPubkey::IsValid(&local_78);
      if (bVar10) {
        cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_278,&local_78);
        local_1b0 = cfd::capi::CreateString((string *)local_278);
        _Var12._M_p = (pointer)local_278._0_8_;
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) goto LAB_003e4b7f;
      }
    }
  }
  if (iVar1 == 7) {
    bVar10 = cfd::core::TaprootScriptTree::IsValid((TaprootScriptTree *)(piVar4 + 0xaa));
    if (!bVar10) {
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_278,(TapBranch *)(piVar4 + 0x8c));
      bVar10 = (pointer)local_278._8_8_ != (pointer)0x0;
      goto LAB_003e4bdd;
    }
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_278,(TapBranch *)(piVar4 + 0xaa));
    local_1b8 = cfd::capi::CreateString((string *)local_278);
    psVar8 = (string *)local_278;
  }
  else {
    bVar10 = false;
LAB_003e4bdd:
    if ((iVar1 == 7) && ((undefined1 *)local_278._0_8_ != local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_);
    }
    if (!bVar10) goto LAB_003e4c3a;
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_1d8,(TapBranch *)(piVar4 + 0x8c));
    local_1b8 = cfd::capi::CreateString(&local_1d8);
    psVar8 = &local_1d8;
  }
  puVar5 = (undefined1 *)(&(psVar8->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5 != &psVar8->field_2) {
    operator_delete(puVar5);
  }
LAB_003e4c3a:
  if ((pubkey != (char **)0x0) && (bVar10 = cfd::core::Pubkey::IsValid(&local_1f8), bVar10)) {
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1d8,&local_1f8);
    local_188 = cfd::capi::CreateString(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  if ((ext_pubkey != (char **)0x0) && (bVar10 = cfd::core::ExtPubkey::IsValid(&local_e8), bVar10)) {
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_1d8,&local_e8);
    local_190 = cfd::capi::CreateString(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  if ((ext_privkey != (char **)0x0) &&
     (bVar10 = cfd::core::ExtPrivkey::IsValid((ExtPrivkey *)local_168), bVar10)) {
    cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_1d8,(ExtPrivkey *)local_168);
    local_198 = cfd::capi::CreateString(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  if (is_multisig != (bool *)0x0) {
    lVar6 = **(long **)((long)descriptor_handle + 0x20);
    lVar7 = (*(long **)((long)descriptor_handle + 0x20))[1];
    *is_multisig = lVar6 != lVar7;
    if (lVar6 != lVar7) {
      *is_multisig = true;
      if (max_key_num != (uint32_t *)0x0) {
        *max_key_num = (int)((ulong)(lVar7 - lVar6) >> 3) * -0x33333333;
      }
      if (req_sig_num != (uint32_t *)0x0) {
        *req_sig_num = piVar4[0x8a];
      }
    }
  }
  if (local_170 != (char *)0x0) {
    *local_58 = local_170;
  }
  if (local_178 != (char *)0x0) {
    *local_1a0 = local_178;
  }
  if (local_180 != (char *)0x0) {
    *redeem_script = local_180;
  }
  if (local_188 != (char *)0x0) {
    *pubkey = local_188;
  }
  if (local_190 != (char *)0x0) {
    *ext_pubkey = local_190;
  }
  if (local_198 != (char *)0x0) {
    *ext_privkey = local_198;
  }
  if (local_1b0 != (char *)0x0) {
    *schnorr_pubkey = local_1b0;
  }
  if (local_1b8 != (char *)0x0) {
    *tree_string = local_1b8;
  }
  if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108);
  }
  if (local_128 != (pointer)0x0) {
    operator_delete(local_128);
  }
  if (local_140 != (pointer)0x0) {
    operator_delete(local_140);
  }
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_);
  }
  if (local_e8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdGetDescriptorRootData(
    void* handle, void* descriptor_handle, int* script_type,
    char** locking_script, char** address, int* hash_type,
    char** redeem_script, int* key_type, char** pubkey, char** ext_pubkey,
    char** ext_privkey, char** schnorr_pubkey, char** tree_string,
    bool* is_multisig, uint32_t* max_key_num, uint32_t* req_sig_num) {
  int ret = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  char* work_schnorr_pubkey = nullptr;
  char* work_tree_string = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_root == nullptr) || buffer->script_root->empty()) {
      warn(CFD_LOG_SOURCE, "invalid script_root.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. invalid script_root.");
    }

    const DescriptorScriptData& desc_data = buffer->script_root->at(0);
    bool is_taproot = (desc_data.address_type == AddressType::kTaprootAddress);
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        if (!desc_data.key.empty()) {
          schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        }
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if (is_taproot && (schnorr_pubkey != nullptr)) {
      if (pubkey_obj.IsValid()) {
        auto spk = SchnorrPubkey::FromPubkey(pubkey_obj);
        work_schnorr_pubkey = CreateString(spk.GetHex());
      } else if (schnorr_pubkey_obj.IsValid()) {
        work_schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
      }
    }
    if (is_taproot && desc_data.tree.IsValid()) {
      work_tree_string = CreateString(desc_data.tree.ToString());
    } else if (is_taproot && !desc_data.branch.ToString().empty()) {
      work_tree_string = CreateString(desc_data.branch.ToString());
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      *is_multisig = !buffer->multisig_key_list->empty();
      if (!buffer->multisig_key_list->empty()) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    if (work_schnorr_pubkey != nullptr) *schnorr_pubkey = work_schnorr_pubkey;
    if (work_tree_string != nullptr) *tree_string = work_tree_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    ret = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
      &work_ext_pubkey, &work_ext_privkey);
  FreeBufferOnError(&work_schnorr_pubkey, &work_tree_string);
  return ret;
}